

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeT2LdStPre(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  uint uVar4;
  void *pvVar5;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar7 = Insn >> 0xc & 0xf;
  uVar6 = Insn >> 0x10 & 0xf;
  if (uVar6 != 0xf) {
    uVar4 = Insn >> 1 & 0x100 | Insn & 0xff;
    pvVar5 = (void *)(ulong)uVar4;
    bVar8 = (Insn >> 0x14 & 1) == 0;
    uVar2 = uVar7;
    if (bVar8) {
      uVar2 = uVar6;
    }
    uVar1 = uVar6;
    if (bVar8) {
      uVar1 = uVar7;
    }
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar2]);
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar1]);
    DVar3 = DecodeT2AddrModeImm8(Inst,uVar6 << 9 | uVar4,Address_00,pvVar5);
    if (MCDisassembler_Success < DVar3) {
      return MCDisassembler_Fail;
    }
    return *(DecodeStatus *)(&DAT_0033b2d0 + (ulong)DVar3 * 4);
  }
  uVar2 = MCInst_getOpcode(Inst);
  uVar6 = uVar2 - 0x962;
  pvVar5 = (void *)(ulong)uVar6;
  if (uVar6 < 0x12) {
    if ((3U >> (uVar6 & 0x1f) & 1) != 0) {
      uVar4 = 0x966;
      if (uVar7 == 0xf) {
        uVar4 = 0x9bd;
      }
      goto LAB_001d5fe8;
    }
    if ((0x300U >> (uVar6 & 0x1f) & 1) != 0) {
      uVar4 = 0x96e;
      goto LAB_001d5fe8;
    }
    uVar4 = 0x976;
    if ((0x30000U >> (uVar6 & 0x1f) & 1) != 0) goto LAB_001d5fe8;
  }
  pvVar5 = (void *)(ulong)(uVar2 - 0x95a);
  if (uVar2 - 0x95a < 2) {
    uVar4 = 0x95e;
  }
  else {
    if (1 < uVar2 - 0x94b) {
      return MCDisassembler_Fail;
    }
    uVar4 = 0x94f;
  }
LAB_001d5fe8:
  MCInst_setOpcode(Inst,uVar4);
  DVar3 = DecodeT2LoadLabel(Inst,Insn,Address_01,pvVar5);
  return DVar3;
}

Assistant:

static DecodeStatus DecodeT2LdStPre(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned load;
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned addr = fieldFromInstruction_4(Insn, 0, 8);
	addr |= fieldFromInstruction_4(Insn, 9, 1) << 8;
	addr |= Rn << 9;
	load = fieldFromInstruction_4(Insn, 20, 1);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDR_PRE:
			case ARM_t2LDR_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRB_PRE:
			case ARM_t2LDRB_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRH_PRE:
			case ARM_t2LDRH_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSB_PRE:
			case ARM_t2LDRSB_POST:
				if (Rt == 15)
					MCInst_setOpcode(Inst, ARM_t2PLIpci);
				else
					MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRSH_PRE:
			case ARM_t2LDRSH_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (!load) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;

	if (load) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm8(Inst, addr, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}